

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteScript(BinaryWriterSpec *this,Script *script)

{
  Var *this_00;
  ExpectationType EVar1;
  pointer puVar2;
  unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> base;
  Expectation *pEVar3;
  ModuleCommand *pMVar4;
  AssertExceptionCommand *pAVar5;
  ActionCommandBase<(wabt::CommandType)2> *pAVar6;
  RegisterCommand *pRVar7;
  AssertModuleCommand<(wabt::CommandType)4> *pAVar8;
  ScriptModuleCommand *pSVar9;
  AssertTrapCommandBase<(wabt::CommandType)10> *pAVar10;
  AssertReturnCommand *pAVar11;
  int __c;
  char *extraout_RDX;
  char *extraout_RDX_00;
  Var *__s;
  Action *action;
  char *pcVar12;
  ulong uVar13;
  string_view s;
  string_view filename_00;
  string_view filename_01;
  string_view s_00;
  string_view filename_02;
  string_view filename_03;
  string_view s_01;
  string_view s_02;
  string_view text;
  string_view sVar14;
  int local_54;
  string filename;
  
  this->script_ = script;
  Stream::Writef(this->json_stream_,"{\"source_filename\": ");
  sVar14._M_str = (this->source_filename_)._M_dataplus._M_p;
  sVar14._M_len = (this->source_filename_)._M_string_length;
  WriteEscapedString(this,sVar14);
  Stream::Writef(this->json_stream_,",\n \"commands\": [\n");
  local_54 = -1;
  uVar13 = 0;
  do {
    puVar2 = (this->script_->commands).
             super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->script_->commands).
                      super__Vector_base<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar13) {
      Stream::Writef(this->json_stream_,"]}\n");
      return (Result)(this->result_).enum_;
    }
    base._M_t.super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = puVar2[uVar13]._M_t;
    if (uVar13 != 0) {
      WriteSeparator(this);
      Stream::Writef(this->json_stream_,"\n");
    }
    Stream::Writef(this->json_stream_,"  {");
    WriteKey(this,"type");
    WriteString(this,_ZZN4wabt12_GLOBAL__N_116BinaryWriterSpec16WriteCommandTypeERKNS_7CommandEE15s_command_names_rel
                     + *(int *)(
                               _ZZN4wabt12_GLOBAL__N_116BinaryWriterSpec16WriteCommandTypeERKNS_7CommandEE15s_command_names_rel
                               + (long)(int)*(CommandType *)
                                             ((long)base._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                                                  .super__Head_base<0UL,_wabt::Command_*,_false>.
                                                  _M_head_impl + 8) * 4));
    WriteSeparator(this);
    switch(*(CommandType *)
            ((long)base._M_t.
                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                   super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8)) {
    case First:
      pMVar4 = cast<wabt::ModuleCommand,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
                (&filename,this,kWasmExtension);
      WriteLocation(this,&(pMVar4->module).loc);
      WriteSeparator(this);
      if ((pMVar4->module).name._M_string_length != 0) {
        WriteKey(this,"name");
        s._M_str = (pMVar4->module).name._M_dataplus._M_p;
        s._M_len = (pMVar4->module).name._M_string_length;
        WriteEscapedString(this,s);
        WriteSeparator(this);
      }
      WriteKey(this,"filename");
      filename_00._M_str = extraout_RDX;
      filename_00._M_len = (size_t)filename._M_dataplus._M_p;
      sVar14 = GetBasename((wabt *)filename._M_string_length,filename_00);
      WriteEscapedString(this,sVar14);
      filename_01._M_str = filename._M_dataplus._M_p;
      filename_01._M_len = filename._M_string_length;
      WriteModule(this,filename_01,&pMVar4->module);
      goto LAB_001496cd;
    case ScriptModule:
      pSVar9 = cast<wabt::ScriptModuleCommand,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
                (&filename,this,kWasmExtension);
      WriteLocation(this,&(pSVar9->module).loc);
      WriteSeparator(this);
      if ((pSVar9->module).name._M_string_length != 0) {
        WriteKey(this,"name");
        s_00._M_str = (pSVar9->module).name._M_dataplus._M_p;
        s_00._M_len = (pSVar9->module).name._M_string_length;
        WriteEscapedString(this,s_00);
        WriteSeparator(this);
      }
      WriteKey(this,"filename");
      filename_02._M_str = extraout_RDX_00;
      filename_02._M_len = (size_t)filename._M_dataplus._M_p;
      sVar14 = GetBasename((wabt *)filename._M_string_length,filename_02);
      WriteEscapedString(this,sVar14);
      filename_03._M_str = filename._M_dataplus._M_p;
      filename_03._M_len = filename._M_string_length;
      WriteScriptModule(this,filename_03,
                        (pSVar9->script_module)._M_t.
                        super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                        .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl);
LAB_001496cd:
      this->num_modules_ = this->num_modules_ + 1;
      std::__cxx11::string::_M_dispose();
      local_54 = (int)uVar13;
      break;
    case Action:
      pAVar6 = cast<wabt::ActionCommandBase<(wabt::CommandType)2>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      action = (pAVar6->action)._M_t.
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
      WriteLocation(this,&action->loc);
      WriteSeparator(this);
      WriteAction(this,action);
      WriteSeparator(this);
      WriteKey(this,"expected");
      goto LAB_0014978e;
    case Register:
      pRVar7 = cast<wabt::RegisterCommand,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      this_00 = &pRVar7->var;
      __s = this_00;
      WriteLocation(this,&this_00->loc);
      WriteSeparator(this);
      if ((pRVar7->var).type_ == Name) {
        WriteKey(this,"name");
        WriteVar(this,this_00);
        WriteSeparator(this);
      }
      else {
        pcVar12 = Var::index(this_00,(char *)__s,__c);
        if ((int)pcVar12 != local_54) {
          __assert_fail("var.index() == last_module_index",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-writer-spec.cc"
                        ,0x214,"void wabt::(anonymous namespace)::BinaryWriterSpec::WriteCommands()"
                       );
        }
      }
      WriteKey(this,"as");
      s_02._M_str = (pRVar7->module_name)._M_dataplus._M_p;
      s_02._M_len = (pRVar7->module_name)._M_string_length;
      WriteEscapedString(this,s_02);
      break;
    case AssertMalformed:
      pAVar8 = cast<wabt::AssertModuleCommand<(wabt::CommandType)4>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_001496fa;
    case AssertInvalid:
      pAVar8 = (AssertModuleCommand<(wabt::CommandType)4> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_001496fa;
    case AssertUnlinkable:
      pAVar8 = (AssertModuleCommand<(wabt::CommandType)4> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_001496fa;
    case AssertUninstantiable:
      pAVar8 = (AssertModuleCommand<(wabt::CommandType)4> *)
               cast<wabt::AssertModuleCommand<(wabt::CommandType)7>,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
LAB_001496fa:
      text._M_str = (pAVar8->text)._M_dataplus._M_p;
      text._M_len = (pAVar8->text)._M_string_length;
      WriteInvalidModule(this,(pAVar8->module)._M_t.
                              super___uniq_ptr_impl<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wabt::ScriptModule_*,_std::default_delete<wabt::ScriptModule>_>
                              .super__Head_base<0UL,_wabt::ScriptModule_*,_false>._M_head_impl,text)
      ;
      this->num_modules_ = this->num_modules_ + 1;
      break;
    case AssertReturn:
      pAVar11 = cast<wabt::AssertReturnCommand,wabt::Command>
                          ((Command *)
                           base._M_t.
                           super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                           .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      WriteLocation(this,&((pAVar11->action)._M_t.
                           super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>
                           .super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      WriteSeparator(this);
      WriteAction(this,(pAVar11->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl);
      WriteSeparator(this);
      pEVar3 = (pAVar11->expected)._M_t.
               super___uniq_ptr_impl<wabt::Expectation,_std::default_delete<wabt::Expectation>_>.
               _M_t.
               super__Tuple_impl<0UL,_wabt::Expectation_*,_std::default_delete<wabt::Expectation>_>.
               super__Head_base<0UL,_wabt::Expectation_*,_false>._M_head_impl;
      EVar1 = pEVar3->type_;
      pcVar12 = "expected";
      if (EVar1 == Values) {
LAB_001497ee:
        WriteKey(this,pcVar12);
      }
      else if (EVar1 == Either) {
        pcVar12 = "either";
        goto LAB_001497ee;
      }
      WriteConstVector(this,&pEVar3->expected);
      break;
    case AssertTrap:
      pAVar10 = (AssertTrapCommandBase<(wabt::CommandType)10> *)
                cast<wabt::AssertTrapCommandBase<(wabt::CommandType)9>,wabt::Command>
                          ((Command *)
                           base._M_t.
                           super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                           .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      goto LAB_00149722;
    case AssertExhaustion:
      pAVar10 = cast<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,wabt::Command>
                          ((Command *)
                           base._M_t.
                           super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                           .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
LAB_00149722:
      WriteLocation(this,&((pAVar10->action)._M_t.
                           super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>
                           .super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      WriteSeparator(this);
      WriteAction(this,(pAVar10->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl);
      WriteSeparator(this);
      WriteKey(this,"text");
      s_01._M_str = (pAVar10->text)._M_dataplus._M_p;
      s_01._M_len = (pAVar10->text)._M_string_length;
      WriteEscapedString(this,s_01);
      WriteSeparator(this);
      WriteKey(this,"expected");
      action = (pAVar10->action)._M_t.
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
      goto LAB_0014978e;
    case AssertException:
      pAVar5 = cast<wabt::AssertExceptionCommand,wabt::Command>
                         ((Command *)
                          base._M_t.
                          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                          .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl);
      WriteLocation(this,&((pAVar5->action)._M_t.
                           super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>
                           .super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl)->loc);
      WriteSeparator(this);
      WriteAction(this,(pAVar5->action)._M_t.
                       super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
                       super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
                       super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl);
      WriteSeparator(this);
      WriteKey(this,"expected");
      action = (pAVar5->action)._M_t.
               super___uniq_ptr_impl<wabt::Action,_std::default_delete<wabt::Action>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Action_*,_std::default_delete<wabt::Action>_>.
               super__Head_base<0UL,_wabt::Action_*,_false>._M_head_impl;
LAB_0014978e:
      WriteActionResultType(this,action);
    }
    Stream::Writef(this->json_stream_,"}");
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

Result BinaryWriterSpec::WriteScript(const Script& script) {
  script_ = &script;
  WriteCommands();
  return result_;
}